

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

bool __thiscall dynet::LookupParameter::is_updated(LookupParameter *this)

{
  bool bVar1;
  
  bVar1 = Model::is_updated_lookup_param(this->mp,this);
  return bVar1;
}

Assistant:

bool LookupParameter::is_updated() {
  return mp->is_updated_lookup_param(this);
}